

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void icetMatrixFrustum(IceTDouble left,IceTDouble right,IceTDouble bottom,IceTDouble top,
                      IceTDouble znear,IceTDouble zfar,IceTDouble *mat_out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  *mat_out = (IceTDouble)(((double)znear + (double)znear) / ((double)right - (double)left));
  auVar1._0_8_ = (double)left + (double)right;
  auVar1._8_8_ = (double)bottom + (double)top;
  auVar2._8_8_ = (double)top - (double)bottom;
  auVar2._0_8_ = (double)right - (double)left;
  auVar2 = divpd(auVar1,auVar2);
  mat_out[1] = 0.0;
  mat_out[2] = 0.0;
  mat_out[3] = 0.0;
  mat_out[4] = 0.0;
  mat_out[5] = (IceTDouble)(((double)znear + (double)znear) / ((double)top - (double)bottom));
  mat_out[6] = 0.0;
  mat_out[7] = 0.0;
  *(undefined1 (*) [16])(mat_out + 8) = auVar2;
  mat_out[10] = (IceTDouble)(-((double)znear + (double)zfar) / ((double)zfar - (double)znear));
  mat_out[0xb] = -1.0;
  mat_out[0xc] = 0.0;
  mat_out[0xd] = 0.0;
  mat_out[0xe] = (IceTDouble)
                 (((double)zfar * -2.0 * (double)znear) / ((double)zfar - (double)znear));
  mat_out[0xf] = 0.0;
  return;
}

Assistant:

ICET_EXPORT void icetMatrixFrustum(IceTDouble left, IceTDouble right,
                                   IceTDouble bottom, IceTDouble top,
                                   IceTDouble znear, IceTDouble zfar,
                                   IceTDouble *mat_out)
{
    mat_out[ 0] = 2.0*znear/(right-left);
    mat_out[ 1] = 0.0;
    mat_out[ 2] = 0.0;
    mat_out[ 3] = 0.0;

    mat_out[ 4] = 0.0;
    mat_out[ 5] = 2.0*znear/(top-bottom);
    mat_out[ 6] = 0.0;
    mat_out[ 7] = 0.0;

    mat_out[ 8] = (right+left)/(right-left);
    mat_out[ 9] = (top+bottom)/(top-bottom);
    mat_out[10] = -(zfar+znear)/(zfar-znear);
    mat_out[11] = -1.0;

    mat_out[12] = 0.0;
    mat_out[13] = 0.0;
    mat_out[14] = -2.0*zfar*znear/(zfar-znear);
    mat_out[15] = 0.0;
}